

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>::
char_spec_handler::on_int(char_spec_handler *this)

{
  char value;
  arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
  *this_00;
  checked_ptr<typename_buffer<char>::value_type> pcVar1;
  
  this_00 = this->formatter;
  value = this->value;
  if (this_00->specs_ != (basic_format_specs<char> *)0x0) {
    basic_writer<duckdb_fmt::v6::buffer_range<char>>::
    write_int<char,duckdb_fmt::v6::basic_format_specs<char>>
              ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this_00,value,this_00->specs_);
    return;
  }
  pcVar1 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                     ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> *)this_00,1);
  *pcVar1 = value;
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.writer_.write_int(value, *formatter.specs_);
      else
        formatter.writer_.write(value);
    }